

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxbasis.hpp
# Opt level: O0

void __thiscall soplex::SPxBasisBase<double>::~SPxBasisBase(SPxBasisBase<double> *this)

{
  Status *pSVar1;
  Desc *in_RDI;
  
  *(undefined ***)&in_RDI->rowstat = &PTR_change_004ec488;
  if (((ulong)in_RDI[4].rowstat.memFactor & 1) != 0) {
    pSVar1 = in_RDI[1].rowstat.data;
    if (pSVar1 != (Status *)0x0) {
      (**(code **)(*(undefined8 *)pSVar1 + 0xe0))();
    }
    in_RDI[1].rowstat.data = (Status *)0x0;
  }
  (*(code *)**(undefined8 **)in_RDI[2].colstat.data)();
  spx_free<soplex::Timer*>((Timer **)0x268229);
  Desc::~Desc(in_RDI);
  DataArray<const_soplex::SVectorBase<double>_*>::~DataArray
            ((DataArray<const_soplex::SVectorBase<double>_*> *)in_RDI);
  DataArray<soplex::SPxId>::~DataArray((DataArray<soplex::SPxId> *)in_RDI);
  return;
}

Assistant:

SPxBasisBase<R>::~SPxBasisBase()
{

   assert(!freeSlinSolver || factor != nullptr);

   if(freeSlinSolver)
   {
      delete factor;
      factor = nullptr;
   }

   theTime->~Timer();
   spx_free(theTime);
}